

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# top_test.cpp
# Opt level: O0

priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process> *
get_top_R_process(priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process>
                  *__return_storage_ptr__,int r,int field,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *pid_list)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  id_t __who;
  char *pcVar4;
  mapped_type *status;
  size_type sVar5;
  const_reference pvVar6;
  mapped_type *pmVar7;
  bool local_3d9;
  allocator local_371;
  string local_370;
  process local_350;
  allocator local_2b1;
  key_type local_2b0;
  allocator local_289;
  key_type local_288;
  undefined1 local_268 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  top_statm;
  key_type local_228;
  int local_204;
  undefined1 local_200 [4];
  int nice;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  stat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  statm;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  allocator local_e1;
  undefined1 local_e0 [8];
  string pid;
  string local_b8;
  dirent *local_98;
  dirent *f;
  DIR *dir;
  char *d;
  string local_78 [8];
  string task_dir;
  vector<process,_std::allocator<process>_> local_48;
  byte local_25;
  compare_process local_24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  compare_process cmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pid_list_local;
  int field_local;
  int r_local;
  priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process> *pq;
  
  pvStack_20 = pid_list;
  compare_process::compare_process(&local_24,field);
  local_25 = 0;
  local_48.super__Vector_base<process,_std::allocator<process>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<process,_std::allocator<process>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<process,_std::allocator<process>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<process,_std::allocator<process>_>::vector(&local_48);
  std::priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process>::
  priority_queue(__return_storage_ptr__,&local_24,&local_48);
  std::vector<process,_std::allocator<process>_>::~vector(&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"/proc",(allocator *)((long)&d + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&d + 7));
  dir = (DIR *)std::__cxx11::string::c_str();
  f = (dirent *)opendir((char *)dir);
  if (f != (dirent *)0x0) {
    while (local_98 = readdir((DIR *)f), local_98 != (dirent *)0x0) {
      pcVar4 = local_98->d_name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b8,pcVar4,(allocator *)(pid.field_2._M_local_buf + 0xf));
      bVar3 = is_digit(&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)(pid.field_2._M_local_buf + 0xf));
      if (bVar3) {
        pcVar4 = local_98->d_name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_e0,pcVar4,&local_e1);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        bVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(pvStack_20);
        local_3d9 = false;
        if (!bVar3) {
          local_f8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvStack_20);
          local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end(pvStack_20);
          local_f0 = std::
                     find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                               (local_f8,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          )local_100,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_e0);
          local_108._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvStack_20);
          local_3d9 = __gnu_cxx::operator==(&local_f0,&local_108);
        }
        if (local_3d9 == false) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stat._M_h._M_single_bucket,"/proc/",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0);
          std::operator+(&local_168,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stat._M_h._M_single_bucket,"/statm");
          read_pid_statm((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)local_148,&local_168);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)&stat._M_h._M_single_bucket);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_200,"/proc/",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0);
          std::operator+(&local_1e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_200,"/stat");
          read_pid_stat((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_1c0,&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)local_200);
          __who = std::__cxx11::stoi((string *)local_e0,(size_t *)0x0,10);
          local_204 = getpriority(PRIO_PROCESS,__who);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_228,"status",
                     (allocator *)((long)&top_statm._M_h._M_single_bucket + 7));
          status = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_1c0,&local_228);
          update_process_cnt(status);
          std::__cxx11::string::~string((string *)&local_228);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&top_statm._M_h._M_single_bucket + 7));
          sVar5 = std::
                  priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process>
                  ::size(__return_storage_ptr__);
          if ((ulong)(long)r <= sVar5) {
            pvVar6 = std::
                     priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process>
                     ::top(__return_storage_ptr__);
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_268,&pvVar6->statm);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_288,"rss",&local_289);
            pmVar7 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)local_148,&local_288);
            iVar1 = *pmVar7;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_2b0,"rss",&local_2b1);
            pmVar7 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)local_268,&local_2b0);
            iVar2 = *pmVar7;
            std::__cxx11::string::~string((string *)&local_2b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
            std::__cxx11::string::~string((string *)&local_288);
            std::allocator<char>::~allocator((allocator<char> *)&local_289);
            if (iVar2 < iVar1) {
              std::
              priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process>
              ::pop(__return_storage_ptr__);
            }
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)local_268);
          }
          sVar5 = std::
                  priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process>
                  ::size(__return_storage_ptr__);
          if (sVar5 < (ulong)(long)r) {
            pcVar4 = local_98->d_name;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_370,pcVar4,&local_371);
            process::process(&local_350,&local_370,
                             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)local_148,
                             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_1c0,local_204);
            std::
            priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process>
            ::push(__return_storage_ptr__,&local_350);
            process::~process(&local_350);
            std::__cxx11::string::~string((string *)&local_370);
            std::allocator<char>::~allocator((allocator<char> *)&local_371);
          }
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_1c0);
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            *)local_148);
          statm._M_h._M_single_bucket._4_4_ = 0;
        }
        else {
          statm._M_h._M_single_bucket._4_4_ = 2;
        }
        std::__cxx11::string::~string((string *)local_e0);
      }
    }
    closedir((DIR *)f);
  }
  local_25 = 1;
  statm._M_h._M_single_bucket._4_4_ = 1;
  std::__cxx11::string::~string(local_78);
  if ((local_25 & 1) == 0) {
    std::priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process>::
    ~priority_queue(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::priority_queue<process, std::vector<process>, compare_process>
get_top_R_process(int r, int field, const std::vector<std::string> &pid_list) {
    compare_process cmp(field);
    std::priority_queue<process, std::vector<process>, compare_process> pq(cmp);

    std::string task_dir = "/proc";
    const char *d = task_dir.c_str();
    if (auto dir = opendir(d)) {
        while (auto f = readdir(dir)) {
            if (is_digit(f->d_name)) {
                std::string pid = f->d_name;

                if (!pid_list.empty() && std::find(pid_list.begin(), pid_list.end(), pid) == pid_list.end()) {
                    continue;
                }

                std::unordered_map<std::string, int> statm = read_pid_statm("/proc/" + pid + "/statm");
                std::unordered_map<std::string, std::string> stat = read_pid_stat("/proc/" + pid + "/stat");
                int nice = getpriority(PRIO_PROCESS, stoi(pid));

                update_process_cnt(stat["status"]);

                if (pq.size() >= r) {
                    std::unordered_map<std::string, int> top_statm = pq.top().statm;
                    if (statm["rss"] > top_statm["rss"]) {
                        pq.pop();
                    }
                }

                if (pq.size() < r) {
                    pq.push(process(f->d_name, statm, stat, nice));
                }
            }
        }
        closedir(dir);
    }

    return pq;
}